

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file_buffer.h
# Opt level: O0

int __thiscall cppcms::http::impl::file_buffer::write_buffer(file_buffer *this)

{
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  long lVar4;
  long lVar5;
  size_t __n;
  void *__ptr;
  size_t sVar6;
  char *in_RDI;
  size_t size;
  file_buffer *in_stack_00000070;
  int local_4;
  
  if ((in_RDI[0xf0] & 1U) == 0) {
    if (*(long *)(in_RDI + 0x48) == 0) {
      get_name(in_stack_00000070);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      pFVar3 = fopen(pcVar2,"w+b");
      *(FILE **)(in_RDI + 0x48) = pFVar3;
      if (*(long *)(in_RDI + 0x48) == 0) {
        return -1;
      }
    }
    iVar1 = fseek(*(FILE **)(in_RDI + 0x48),0,2);
    if (iVar1 == 0) {
      lVar4 = std::streambuf::pptr();
      lVar5 = std::streambuf::pbase();
      __n = lVar4 - lVar5;
      if (__n != 0) {
        __ptr = (void *)std::streambuf::pbase();
        sVar6 = fwrite(__ptr,1,__n,*(FILE **)(in_RDI + 0x48));
        if (sVar6 != __n) {
          return -1;
        }
      }
      *(size_t *)(in_RDI + 0x58) = __n + *(long *)(in_RDI + 0x58);
      pcVar2 = (char *)std::streambuf::pbase();
      std::streambuf::epptr();
      std::streambuf::setp(in_RDI,pcVar2);
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int write_buffer()
	{
		if(closed_)
			return -1;
		if(!f_) {
			get_name();
			f_ = booster::nowide::fopen(name_.c_str(),"w+b");
			if(!f_)
				return -1;
		}
		if(fseek(f_,0,SEEK_END) !=0)
			return -1;
		size_t size = pptr()-pbase();
		if(size != 0 && fwrite(pbase(),1,size,f_)!=size)
			return -1;
		file_size_ += size;
		setp(pbase(),epptr());
		return 0;
	}